

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

bool __thiscall
cmTarget::IsLinkInterfaceDependentStringProperty(cmTarget *this,string *p,string *config)

{
  CompatibleInterfaces *pCVar1;
  const_iterator cVar2;
  bool bVar3;
  
  bVar3 = false;
  if ((this->TargetTypeValue != OBJECT_LIBRARY) && (this->TargetTypeValue != INTERFACE_LIBRARY)) {
    pCVar1 = GetCompatibleInterfaces(this,config);
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(pCVar1->PropsString)._M_t,p);
    bVar3 = (_Rb_tree_header *)cVar2._M_node !=
            &(pCVar1->PropsString)._M_t._M_impl.super__Rb_tree_header;
  }
  return bVar3;
}

Assistant:

bool cmTarget::IsLinkInterfaceDependentStringProperty(const std::string &p,
                                    const std::string& config) const
{
  if (this->TargetTypeValue == OBJECT_LIBRARY
      || this->TargetTypeValue == INTERFACE_LIBRARY)
    {
    return false;
    }
  return this->GetCompatibleInterfaces(config).PropsString.count(p) > 0;
}